

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O2

void calc_similarity_from_indexer_with_references<double,long>
               (double *numeric_data,int *categ_data,double *Xc,long *Xc_ind,long *Xc_indptr,
               size_t nrows,int nthreads,bool standardize_dist,IsoForest *model_outputs,
               ExtIsoForest *model_outputs_ext,double *rmat,TreesIndexer *indexer,bool is_col_major,
               size_t ld_numeric,size_t ld_categ)

{
  pointer pSVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long *Xc_indptr_00;
  bool bVar6;
  size_t ix_1;
  size_t sVar7;
  long lVar8;
  int *piVar9;
  runtime_error *this;
  ExtIsoForest *pEVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  long *Xc_ind_00;
  size_t ref;
  size_t sVar14;
  double *Xr_indptr;
  double *pdVar15;
  size_t ix;
  long lVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar20;
  undefined1 auVar19 [16];
  allocator<char> local_1a4;
  allocator<char> local_1a3;
  allocator<char> local_1a2;
  allocator<char> local_1a1;
  int *local_1a0;
  double *local_198;
  double dStack_190;
  size_t local_180;
  SignalSwitcher ss;
  unique_ptr<double[],_std::default_delete<double[]>_> ignored;
  vector<long,_std::allocator<long>_> terminal_indices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_198 = numeric_data;
  sVar7 = get_number_of_reference_points(indexer);
  if (sVar7 == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Unexpected error in ",&local_1a1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/dist.hpp"
               ,&local_1a2);
    std::operator+(&local_50,&local_70,&local_90);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,":",&local_1a3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ignored,
                   &local_50,&local_b0);
    std::__cxx11::to_string(&local_d0,0x6c9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ignored,
                   &local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,
               ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
               ,&local_1a4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &terminal_indices,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   &local_f0);
    std::runtime_error::runtime_error(this,(string *)&terminal_indices);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1a0 = categ_data;
  SignalSwitcher::SignalSwitcher(&ss);
  pEVar10 = (ExtIsoForest *)model_outputs;
  if (model_outputs == (IsoForest *)0x0) {
    pEVar10 = model_outputs_ext;
  }
  lVar8 = ((long)(pEVar10->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pEVar10->hplanes).
                super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  std::vector<long,_std::allocator<long>_>::vector
            (&terminal_indices,lVar8 * nrows,(allocator_type *)&ignored);
  ignored._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       operator_new__(-(ulong)(nrows >> 0x3d != 0) | nrows * 8);
  pdVar12 = (double *)0x0;
  pdVar15 = (double *)0x0;
  if (is_col_major) {
    pdVar15 = Xc;
  }
  Xc_ind_00 = (long *)0x0;
  if (is_col_major) {
    Xc_ind_00 = Xc_ind;
  }
  Xr_indptr = (double *)Xc_indptr;
  Xc_indptr_00 = (long *)0x0;
  if (is_col_major) {
    Xr_indptr = pdVar12;
    Xc_ind = (long *)pdVar12;
    Xc_indptr_00 = Xc_indptr;
    Xc = pdVar12;
  }
  predict_iforest<double,long>
            (local_198,local_1a0,is_col_major,ld_numeric,ld_categ,pdVar15,Xc_ind_00,Xc_indptr_00,Xc,
             Xc_ind,(long *)Xr_indptr,nrows,nthreads,false,model_outputs,model_outputs_ext,
             (double *)
             ignored._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl,
             terminal_indices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start,(double *)0x0,indexer);
  std::__uniq_ptr_impl<double,_std::default_delete<double[]>_>::reset
            ((__uniq_ptr_impl<double,_std::default_delete<double[]>_> *)&ignored,(pointer)0x0);
  check_interrupt_switch(&ss);
  bVar6 = interrupt_switch;
  local_180 = sVar7 * 8;
  piVar9 = (int *)0x0;
  pdVar15 = rmat;
  while (piVar9 != (int *)nrows) {
    local_1a0 = piVar9;
    if ((bVar6 & 1U) == 0) {
      memset(rmat + (long)piVar9 * sVar7,0,local_180);
      local_198 = (double *)
                  (terminal_indices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)piVar9);
      for (lVar11 = 0; lVar11 != lVar8; lVar11 = lVar11 + 1) {
        pSVar1 = (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar2 = pSVar1[lVar11].n_terminal;
        if ((uVar2 & 1) == 0) {
          lVar13 = (uVar2 - 1) * (uVar2 >> 1);
        }
        else {
          lVar13 = (uVar2 - 1 >> 1) * uVar2;
        }
        lVar3 = *(long *)&pSVar1[lVar11].reference_points.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
        lVar4 = *(long *)&pSVar1[lVar11].node_distances.
                          super__Vector_base<double,_std::allocator<double>_>;
        lVar5 = *(long *)&pSVar1[lVar11].node_depths.
                          super__Vector_base<double,_std::allocator<double>_>;
        dVar20 = local_198[lVar11 * nrows];
        for (sVar14 = 0; sVar7 != sVar14; sVar14 = sVar14 + 1) {
          dVar17 = *(double *)(lVar3 + sVar14 * 8);
          if (dVar20 == dVar17) {
            dVar17 = *(double *)(lVar5 + (long)dVar20 * 8) + 3.0;
          }
          else {
            if ((ulong)dVar20 < (ulong)dVar17) {
              lVar16 = (long)dVar17 + (lVar13 - (long)dVar20) +
                       ~(((uVar2 - (long)dVar20) + -1) * (uVar2 - (long)dVar20) >> 1);
            }
            else {
              lVar16 = (((long)dVar20 + lVar13) - (long)dVar17) +
                       ~(((uVar2 - (long)dVar17) + -1) * (uVar2 - (long)dVar17) >> 1);
            }
            dVar17 = *(double *)(lVar4 + lVar16 * 8);
          }
          pdVar15[sVar14] = dVar17 + pdVar15[sVar14];
        }
      }
    }
    pdVar15 = (double *)((long)pdVar15 + local_180);
    piVar9 = (int *)((long)local_1a0 + 1);
  }
  check_interrupt_switch(&ss);
  auVar18._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar18._0_8_ = lVar8;
  auVar18._12_4_ = 0x45300000;
  dVar20 = auVar18._8_8_ - 1.9342813113834067e+25;
  pdVar15 = (double *)(dVar20 + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
  if (standardize_dist) {
    lVar8 = lVar8 * 2;
    auVar19._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar19._0_8_ = lVar8;
    auVar19._12_4_ = 0x45300000;
    local_198 = pdVar15;
    dStack_190 = dVar20;
    for (lVar11 = 0; sVar7 * nrows - lVar11 != 0; lVar11 = lVar11 + 1) {
      dVar20 = exp2(-(rmat[lVar11] - (double)local_198) /
                    ((auVar19._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)));
      rmat[lVar11] = dVar20;
    }
  }
  else {
    for (lVar8 = 0; sVar7 * nrows - lVar8 != 0; lVar8 = lVar8 + 1) {
      rmat[lVar8] = rmat[lVar8] / (double)pdVar15;
    }
  }
  check_interrupt_switch(&ss);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&ignored);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&terminal_indices.super__Vector_base<long,_std::allocator<long>_>);
  SignalSwitcher::~SignalSwitcher(&ss);
  return;
}

Assistant:

void calc_similarity_from_indexer_with_references
(
    real_t *restrict numeric_data, int *restrict categ_data,
    real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
    size_t nrows, int nthreads, bool standardize_dist,
    IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
    double *restrict rmat,
    TreesIndexer *indexer, bool is_col_major, size_t ld_numeric, size_t ld_categ
)
{
    size_t n_ref = get_number_of_reference_points(*indexer);
    if (unlikely(!n_ref)) unexpected_error();

    SignalSwitcher ss;

    size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
    std::vector<sparse_ix> terminal_indices(nrows * ntrees);
    std::unique_ptr<double[]> ignored(new double[nrows]);
    predict_iforest(numeric_data, categ_data,
                    is_col_major, ld_numeric, ld_categ,
                    is_col_major? Xc : nullptr, is_col_major? Xc_ind : nullptr, is_col_major? Xc_indptr : nullptr,
                    is_col_major? (real_t*)nullptr : Xc, is_col_major? (sparse_ix*)nullptr : Xc_ind, is_col_major? (sparse_ix*)nullptr : Xc_indptr,
                    nrows, nthreads, false,
                    model_outputs, model_outputs_ext,
                    ignored.get(), terminal_indices.data(),
                    (double*)NULL,
                    indexer);
    ignored.reset();

    #ifndef _OPENMP
    nthreads = 1;
    #endif

    check_interrupt_switch(ss);

    #pragma omp parallel for schedule(static) num_threads(nthreads) \
            shared(rmat, terminal_indices, nrows, n_ref, indexer, ntrees)
    for (size_t_for row = 0; row < (decltype(row))nrows; row++)
    {
        if (interrupt_switch) continue;

        size_t i, j;
        size_t n_terminal_this;
        size_t ncomb_this;
        size_t *restrict ref_this;
        sparse_ix *restrict ind_this;
        double *restrict node_depths_this;
        double *restrict node_dist_this;
        double *rmat_this = rmat + row*n_ref;
        memset(rmat_this, 0, n_ref*sizeof(double));
        for (size_t tree = 0; tree < ntrees; tree++)
        {
            ref_this = indexer->indices[tree].reference_points.data();
            ind_this = terminal_indices.data() + tree*nrows;
            node_depths_this = indexer->indices[tree].node_depths.data();
            n_terminal_this = indexer->indices[tree].n_terminal;
            node_dist_this = indexer->indices[tree].node_distances.data();
            ncomb_this = calc_ncomb(n_terminal_this);
            for (size_t ref = 0; ref < n_ref; ref++)
            {
                i = ind_this[row];
                j = ref_this[ref];

                if (unlikely(i == j))
                    rmat_this[ref] += node_depths_this[i] + 3.;
                else
                    rmat_this[ref] += node_dist_this[ix_comb(i, j, n_terminal_this, ncomb_this)];
            }
        }
    }

    check_interrupt_switch(ss);

    size_t size_rmat = nrows * n_ref;
    if (standardize_dist)
    {
        double ntrees_dbl = (double)ntrees;
        double div_trees = (double)(mult2(ntrees));
        #ifndef _WIN32
        #pragma omp simd
        #endif
        for (size_t ix = 0; ix < size_rmat; ix++)
            rmat[ix] = std::exp2( - (rmat[ix] - ntrees_dbl) / div_trees);
    }

    else
    {
        double div_trees = (double)ntrees;
        for (size_t ix = 0; ix < size_rmat; ix++)
            rmat[ix] /= div_trees;
    }

    check_interrupt_switch(ss);
}